

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void recfield(LexState *ls,ConsControl *cc)

{
  int iVar1;
  int a;
  FuncState *fs;
  int b;
  int c;
  expdesc key;
  expdesc val;
  
  fs = ls->fs;
  iVar1 = fs->freereg;
  if ((ls->t).token == 0x11d) {
    if (0x7ffffffd < cc->nh) {
      errorlimit(fs,0x7ffffffd,"items in a constructor");
    }
    checkname(ls,&key);
  }
  else {
    yindex(ls,&key);
  }
  cc->nh = cc->nh + 1;
  checknext(ls,0x3d);
  b = luaK_exp2RK(fs,&key);
  expr(ls,&val);
  a = (cc->t->u).s.info;
  c = luaK_exp2RK(fs,&val);
  luaK_codeABC(fs,OP_SETTABLE,a,b,c);
  fs->freereg = iVar1;
  return;
}

Assistant:

static void recfield(LexState*ls,struct ConsControl*cc){
FuncState*fs=ls->fs;
int reg=ls->fs->freereg;
expdesc key,val;
int rkkey;
if(ls->t.token==TK_NAME){
luaY_checklimit(fs,cc->nh,(INT_MAX-2),"items in a constructor");
checkname(ls,&key);
}
else
yindex(ls,&key);
cc->nh++;
checknext(ls,'=');
rkkey=luaK_exp2RK(fs,&key);
expr(ls,&val);
luaK_codeABC(fs,OP_SETTABLE,cc->t->u.s.info,rkkey,luaK_exp2RK(fs,&val));
fs->freereg=reg;
}